

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O1

void __thiscall
agge::tests::RendererTests::RenditionAdapterObeysHorizontalLimits(RendererTests *this)

{
  pointer puVar1;
  uchar *pixels;
  ulong uVar2;
  uint8_t covers [5];
  bitmap<unsigned_char,_2UL,_0UL> bitmap;
  blender<unsigned_char,_unsigned_char> blender;
  uint8_t reference [30];
  cover_type local_c0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  ulong local_a0;
  blender<unsigned_char,_unsigned_char> local_98;
  string local_78;
  uchar local_58 [32];
  LocationInfo local_38;
  
  local_c0[4] = 0xe1;
  local_c0[0] = 'Q';
  local_c0[1] = 0xff;
  local_c0[2] = '\x13';
  local_c0[3] = 0x90;
  local_98.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pixels = (uchar *)operator_new(0x1e);
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = pixels + 0x1e;
  pixels[0xe] = '\0';
  pixels[0xf] = '\0';
  pixels[0x10] = '\0';
  pixels[0x11] = '\0';
  pixels[0x12] = '\0';
  pixels[0x13] = '\0';
  pixels[0x14] = '\0';
  pixels[0x15] = '\0';
  pixels[0x16] = '\0';
  pixels[0x17] = '\0';
  pixels[0x18] = '\0';
  pixels[0x19] = '\0';
  pixels[0x1a] = '\0';
  pixels[0x1b] = '\0';
  pixels[0x1c] = '\0';
  pixels[0x1d] = '\0';
  pixels[0] = '\0';
  pixels[1] = '\0';
  pixels[2] = '\0';
  pixels[3] = '\0';
  pixels[4] = '\0';
  pixels[5] = '\0';
  pixels[6] = '\0';
  pixels[7] = '\0';
  pixels[8] = '\0';
  pixels[9] = '\0';
  pixels[10] = '\0';
  pixels[0xb] = '\0';
  pixels[0xc] = '\0';
  pixels[0xd] = '\0';
  pixels[0xe] = '\0';
  pixels[0xf] = '\0';
  local_a0 = 0x300000008;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = pixels;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  mocks::blender<unsigned_char,_unsigned_char>::operator()(&local_98,pixels,0,0,1,local_c0 + 2);
  mocks::blender<unsigned_char,_unsigned_char>::operator()(&local_98,pixels + 5,5,0,3,local_c0);
  puVar1 = local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = local_a0 & 0xffffffff;
  mocks::blender<unsigned_char,_unsigned_char>::operator()
            (&local_98,
             local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start + uVar2 * 2 + 4,0,2,2,local_c0 + 3);
  mocks::blender<unsigned_char,_unsigned_char>::operator()
            (&local_98,puVar1 + uVar2 * 2 + 0xb,7,2,1,local_c0);
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = 0x90;
  local_58[0x15] = 0xe1;
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = 'Q';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0] = '\x13';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = 'Q';
  local_58[6] = 0xff;
  local_58[7] = '\x13';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_38,&local_78,0x2b1);
  ut::are_equal<unsigned_char,30ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [30])local_58,&local_b8,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.filename._M_dataplus._M_p != &local_38.filename.field_2) {
    operator_delete(local_38.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.filling_log.
      super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.filling_log.
                    super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

test( RenditionAdapterObeysHorizontalLimits )
			{
				// INIT
				uint8_t covers[] = { 0x51, 0xFF, 0x13, 0x90, 0xE1, };
				mocks::blender<uint8_t, uint8_t> blender;
				mocks::bitmap<uint8_t, 2> bitmap(8, 3);
				renderer::adapter< mocks::bitmap<uint8_t, 2>, mocks::blender<uint8_t, uint8_t> > r(bitmap, zero(), 0, blender);

				// ACT
				r.set_y(0);
				r(-2, 3, covers);
				r(5, 5, covers);
				
				r.set_y(1);
				r(-5, 5, covers);
				r(8, 5, covers);
				
				r.set_y(2);
				r(-3, 5, covers);
				r(7, 4, covers);

				// ASSERT
				uint8_t reference[] = {
					0x13, 0x00, 0x00, 0x00, 0x00, 0x51, 0xFF, 0x13, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,	0x00, 0x00, 0x00,
					0x90, 0xE1, 0x00, 0x00, 0x00, 0x00, 0x00, 0x51, 0x00, 0x00,
				};

				assert_equal(reference, bitmap.data);
			}